

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImGuiPayload *pIVar1;
  ImGuiID IVar2;
  ImGuiID IVar3;
  uint uVar4;
  ImGuiContext *pIVar5;
  bool bVar6;
  int iVar7;
  ImGuiPayload *pIVar8;
  float fVar9;
  ImRect r;
  ImRect local_38;
  
  pIVar5 = GImGui;
  if ((type != (char *)0x0) &&
     (((GImGui->DragDropPayload).DataFrameCount == -1 ||
      (iVar7 = strcmp(type,(GImGui->DragDropPayload).DataType), iVar7 != 0)))) {
    return (ImGuiPayload *)0x0;
  }
  IVar2 = pIVar5->DragDropTargetId;
  IVar3 = pIVar5->DragDropAcceptIdPrev;
  local_38.Min = (pIVar5->DragDropTargetRect).Min;
  local_38.Max = (pIVar5->DragDropTargetRect).Max;
  fVar9 = (local_38.Max.y - local_38.Min.y) * (local_38.Max.x - local_38.Min.x);
  if (pIVar5->DragDropAcceptIdCurrRectSurface <= fVar9 &&
      fVar9 != pIVar5->DragDropAcceptIdCurrRectSurface) {
    return (ImGuiPayload *)0x0;
  }
  pIVar5->DragDropAcceptFlags = flags;
  pIVar5->DragDropAcceptIdCurr = IVar2;
  pIVar5->DragDropAcceptIdCurrRectSurface = fVar9;
  (pIVar5->DragDropPayload).Preview = IVar3 == IVar2;
  uVar4 = pIVar5->DragDropSourceFlags;
  if (((uVar4 | flags) >> 0xb & 1) == 0 && IVar3 == IVar2) {
    RenderDragDropTargetRect(&local_38,&pIVar5->DragDropTargetClipRect);
    uVar4 = pIVar5->DragDropSourceFlags;
  }
  pIVar1 = &pIVar5->DragDropPayload;
  pIVar5->DragDropAcceptFrameCount = pIVar5->FrameCount;
  if (((uVar4 & 0x10) == 0) || (pIVar5->DragDropMouseButton != -1)) {
    if (IVar3 == IVar2) {
      bVar6 = true;
      if ((GImGui->IO).MouseDown[pIVar5->DragDropMouseButton] == true) {
        bVar6 = TestKeyOwner(pIVar5->DragDropMouseButton + ImGuiKey_MouseLeft,0);
        bVar6 = !bVar6;
      }
      goto LAB_0018f955;
    }
  }
  else if (IVar3 == IVar2) {
    bVar6 = pIVar5->DragDropSourceFrameCount < pIVar5->FrameCount;
    goto LAB_0018f955;
  }
  bVar6 = false;
LAB_0018f955:
  pIVar8 = (ImGuiPayload *)0x0;
  if (bVar6 != false) {
    pIVar8 = pIVar1;
  }
  if ((flags & 0x400U) != 0) {
    pIVar8 = pIVar1;
  }
  (pIVar5->DragDropPayload).Delivery = bVar6;
  if (bVar6 != false) {
    if ((pIVar5->DebugLogFlags & 1) != 0) {
      DebugLog("[dragdrop] AcceptDragDropPayload(): 0x%08X: payload delivery\n",
               (ulong)pIVar5->DragDropTargetId);
      return pIVar1;
    }
    return pIVar1;
  }
  return pIVar8;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface > g.DragDropAcceptIdCurrRectSurface)
        return NULL;

    g.DragDropAcceptFlags = flags;
    g.DragDropAcceptIdCurr = g.DragDropTargetId;
    g.DragDropAcceptIdCurrRectSurface = r_surface;
    //IMGUI_DEBUG_LOG("AcceptDragDropPayload(): %08X: accept\n", g.DragDropTargetId);

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that live for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        RenderDragDropTargetRect(r, g.DragDropTargetClipRect);

    g.DragDropAcceptFrameCount = g.FrameCount;
    if ((g.DragDropSourceFlags & ImGuiDragDropFlags_SourceExtern) && g.DragDropMouseButton == -1)
        payload.Delivery = was_accepted_previously && (g.DragDropSourceFrameCount < g.FrameCount);
    else
        payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting OS window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    if (payload.Delivery)
        IMGUI_DEBUG_LOG_ACTIVEID("[dragdrop] AcceptDragDropPayload(): 0x%08X: payload delivery\n", g.DragDropTargetId);
    return &payload;
}